

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_sorting.cpp
# Opt level: O0

void sorting::grayscale(vector<Palette,_std::allocator<Palette>_> *palettes,
                       array<std::optional<Rgba>,_32769UL> *colors)

{
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  size_type sVar4;
  array<unsigned_short,_4UL> *this;
  iterator __first;
  iterator __last;
  const_iterator pvVar5;
  Rgba *pRVar6;
  uint16_t *puVar7;
  value_type *slot;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::optional<Rgba>,_32769UL> *__range1;
  Palette *palette;
  array<std::optional<Rgba>,_32769UL> *colors_local;
  vector<Palette,_std::allocator<Palette>_> *palettes_local;
  
  Options::verbosePrint(&options,'\x02',"Sorting grayscale-only palette...\n");
  sVar4 = std::vector<Palette,_std::allocator<Palette>_>::size(palettes);
  if (sVar4 == 1) {
    this = &std::vector<Palette,_std::allocator<Palette>_>::operator[](palettes,0)->colors;
    __first = std::array<unsigned_short,_4UL>::begin(this);
    __last = std::array<unsigned_short,_4UL>::end(this);
    std::fill<unsigned_short*,unsigned_short>(__first,__last,&Rgba::transparent);
    __end1 = std::array<std::optional<Rgba>,_32769UL>::begin(colors);
    pvVar5 = std::array<std::optional<Rgba>,_32769UL>::end(colors);
    for (; __end1 != pvVar5; __end1 = __end1 + 1) {
      bVar1 = std::optional<Rgba>::has_value(__end1);
      if (bVar1) {
        pRVar6 = std::optional<Rgba>::operator->(__end1);
        bVar1 = Rgba::isTransparent(pRVar6);
        if (!bVar1) {
          pRVar6 = std::optional<Rgba>::operator->(__end1);
          uVar3 = Rgba::cgbColor(pRVar6);
          pRVar6 = std::optional<Rgba>::operator->(__end1);
          bVar2 = Rgba::grayIndex(pRVar6);
          puVar7 = Palette::operator[]((Palette *)this,(ulong)bVar2);
          *puVar7 = uVar3;
        }
      }
    }
    return;
  }
  __assert_fail("palettes.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_sorting.cpp"
                ,0x34,
                "void sorting::grayscale(std::vector<Palette> &, const std::array<std::optional<Rgba>, 32769> &)"
               );
}

Assistant:

void grayscale(std::vector<Palette> &palettes,
               std::array<std::optional<Rgba>, 0x8001> const &colors) {
	options.verbosePrint(Options::VERB_LOG_ACT, "Sorting grayscale-only palette...\n");

	// This method is only applicable if there are at most as many colors as colors per palette, so
	// we should only have a single palette.
	assert(palettes.size() == 1);

	Palette &palette = palettes[0];
	std::fill(palette.colors.begin(), palette.colors.end(), Rgba::transparent);
	for (auto const &slot : colors) {
		if (!slot.has_value() || slot->isTransparent()) {
			continue;
		}
		palette[slot->grayIndex()] = slot->cgbColor();
	}
}